

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_long_fs.c
# Opt level: O0

int main(void)

{
  test_state *state_00;
  void *__ptr;
  test_state state;
  aec_stream strm;
  int status;
  code *local_b0;
  uchar *local_a0;
  int local_4;
  
  local_a0 = (uchar *)malloc(0x100);
  state_00 = (test_state *)malloc(0x200);
  __ptr = malloc(0x100);
  if (((local_a0 == (uchar *)0x0) || (state_00 == (test_state *)0x0)) || (__ptr == (void *)0x0)) {
    printf("Not enough memory.\n");
    local_4 = 99;
  }
  else {
    local_b0 = encode_decode_large;
    update_state((test_state *)&local_b0);
    local_4 = check_long_fs(state_00);
    free(local_a0);
    free(state_00);
    free(__ptr);
  }
  return local_4;
}

Assistant:

int main (void)
{
    int status;
    struct aec_stream strm;
    struct test_state state;

    state.buf_len = state.ibuf_len = BUF_SIZE;
    state.cbuf_len = 2 * BUF_SIZE;

    state.ubuf = (unsigned char *)malloc(state.buf_len);
    state.cbuf = (unsigned char *)malloc(state.cbuf_len);
    state.obuf = (unsigned char *)malloc(state.buf_len);

    if (!state.ubuf || !state.cbuf || !state.obuf) {
        printf("Not enough memory.\n");
        return 99;
    }

    strm.flags = AEC_DATA_PREPROCESS;
    state.strm = &strm;
    strm.bits_per_sample = 16;
    strm.block_size = 64;
    strm.rsi = 1;
    state.codec = encode_decode_large;
    update_state(&state);

    status = check_long_fs(&state);
    if (status)
        goto DESTRUCT;

DESTRUCT:
    free(state.ubuf);
    free(state.cbuf);
    free(state.obuf);

    return status;
}